

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeRgba1.cpp
# Opt level: O0

void tryCatchExample(char *fileName,Rgba *pixels,int width,int height)

{
  exception *exc;
  Rgba *in_stack_00000038;
  char *in_stack_00000040;
  
  writeRgba1(in_stack_00000040,in_stack_00000038,fileName._4_4_,(int)fileName);
  return;
}

Assistant:

void
tryCatchExample (const char fileName[], const Rgba* pixels, int width, int height) {
    // [begin tryCatchExample]
    try
    {
        writeRgba1 (fileName, pixels, width, height);
    }
    catch (const std::exception &exc)
    {
        std::cerr << exc.what() << std::endl;
    }
    // [end tryCatchExample]
}